

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O3

void compact_with_snapshot_open_test(void)

{
  fdb_status fVar1;
  size_t sVar2;
  size_t sVar3;
  fdb_kvs_handle *pfVar4;
  ulong uVar5;
  long extraout_RDX;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  fdb_kvs_handle **ptr_handle;
  char *pcVar9;
  fdb_kvs_handle *pfVar10;
  fdb_file_handle *fhandle;
  long lVar11;
  fdb_custom_cmp_variable p_Var12;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db2;
  fdb_kvs_handle *snap_db;
  fdb_kvs_handle *db;
  cb_args cb_args;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char bodybuf [256];
  char keybuf [256];
  fdb_file_handle *pfStack_928;
  timeval tStack_920;
  fdb_config fStack_910;
  code *pcStack_818;
  fdb_kvs_handle *pfStack_810;
  fdb_kvs_handle *pfStack_808;
  ulong uStack_800;
  fdb_kvs_handle *pfStack_7f8;
  fdb_kvs_config fStack_7f0;
  timeval tStack_7d8;
  char *pcStack_7c8;
  char *pcStack_7c0;
  fdb_kvs_handle *pfStack_7b8;
  char *pcStack_7b0;
  char *pcStack_7a8;
  code *pcStack_7a0;
  fdb_file_handle *pfStack_790;
  int iStack_784;
  fdb_kvs_handle *pfStack_780;
  fdb_kvs_handle *pfStack_778;
  fdb_kvs_handle *pfStack_770;
  fdb_kvs_handle *pfStack_768;
  fdb_kvs_handle *pfStack_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  timeval tStack_738;
  fdb_kvs_config fStack_728;
  fdb_config fStack_710;
  char acStack_618 [256];
  char acStack_518 [272];
  char *pcStack_408;
  fdb_kvs_handle *pfStack_400;
  char *pcStack_3f0;
  code *pcStack_3e8;
  fdb_snapshot_info_t *pfStack_3d8;
  fdb_kvs_handle *pfStack_3d0;
  uint64_t uStack_3c8;
  timeval tStack_3c0;
  size_t sStack_3b0;
  fdb_kvs_handle **ppfStack_3a8;
  code *pcStack_3a0;
  fdb_kvs_handle *local_398;
  fdb_kvs_handle *local_390;
  fdb_kvs_handle *local_388;
  fdb_kvs_handle *local_380;
  undefined8 local_378;
  undefined8 uStack_370;
  fdb_kvs_handle *local_368;
  timeval local_358;
  fdb_kvs_config local_348;
  fdb_config local_330;
  char local_238 [256];
  fdb_kvs_handle *local_138 [33];
  
  pcStack_3a0 = (code *)0x1131cb;
  gettimeofday(&local_358,(__timezone_ptr_t)0x0);
  pcStack_3a0 = (code *)0x1131d0;
  memleak_start();
  pcStack_3a0 = (code *)0x1131dd;
  fdb_get_default_config();
  pcStack_3a0 = (code *)0x1131ea;
  fdb_get_default_kvs_config();
  local_330.compaction_cb_ctx = &local_378;
  local_378 = 0;
  uStack_370 = 0;
  local_368 = (fdb_kvs_handle *)0x0;
  local_330.wal_threshold = 0x400;
  local_330.flags = 1;
  local_330.compaction_cb = compaction_cb_get;
  local_330.compaction_cb_mask = 0x1b;
  pcStack_3a0 = (code *)0x113230;
  system("rm -rf  compact_test* > errorlog.txt");
  pcStack_3a0 = (code *)0x113245;
  fdb_open((fdb_file_handle **)&local_398,"./compact_test1",&local_330);
  pcStack_3a0 = (code *)0x11325f;
  fdb_kvs_open((fdb_file_handle *)local_398,&local_380,"db",&local_348);
  pcStack_3a0 = (code *)0x113272;
  fdb_kvs_open((fdb_file_handle *)local_398,&local_390,"db",&local_348);
  uVar5 = 0;
  do {
    pcStack_3a0 = (code *)0x11329e;
    sprintf((char *)local_138,"key%04d",uVar5);
    pcStack_3a0 = (code *)0x1132ad;
    sprintf(local_238,"body%04d",uVar5);
    pfVar4 = local_380;
    pcStack_3a0 = (code *)0x1132ba;
    sVar2 = strlen((char *)local_138);
    pcStack_3a0 = (code *)0x1132c5;
    sVar3 = strlen(local_238);
    pcStack_3a0 = (code *)0x1132d9;
    ptr_handle = local_138;
    pfVar10 = pfVar4;
    fVar1 = fdb_set_kv(pfVar4,local_138,sVar2,local_238,sVar3);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcStack_3a0 = (code *)0x11339e;
      compact_with_snapshot_open_test();
      goto LAB_0011339e;
    }
    uVar6 = (int)uVar5 + 1;
    uVar5 = (ulong)uVar6;
  } while (uVar6 != 100000);
  ptr_handle = (fdb_kvs_handle **)0x1;
  pcStack_3a0 = (code *)0x1132f9;
  pfVar10 = local_398;
  fVar1 = fdb_commit((fdb_file_handle *)local_398,'\x01');
  if (fVar1 == FDB_RESULT_SUCCESS) {
    local_368 = local_390;
    ptr_handle = (fdb_kvs_handle **)0x0;
    pcStack_3a0 = (code *)0x113316;
    pfVar10 = local_398;
    fVar1 = fdb_compact((fdb_file_handle *)local_398,(char *)0x0);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001133a3;
    ptr_handle = &local_388;
    pcStack_3a0 = (code *)0x113332;
    pfVar10 = local_390;
    fVar1 = fdb_snapshot_open(local_390,ptr_handle,100000);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001133a8;
    pcStack_3a0 = (code *)0x113340;
    fdb_kvs_close(local_388);
    pcStack_3a0 = (code *)0x113349;
    fVar1 = fdb_close((fdb_file_handle *)local_398);
    pfVar10 = local_398;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001133ad;
    pcStack_3a0 = (code *)0x113352;
    fVar1 = fdb_shutdown();
    pfVar10 = local_398;
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcVar9 = "%s PASSED\n";
      if (compact_with_snapshot_open_test()::__test_pass != '\0') {
        pcVar9 = "%s FAILED\n";
      }
      pcStack_3a0 = (code *)0x113387;
      fprintf(_stderr,pcVar9,"compact with snapshot_open test");
      return;
    }
  }
  else {
LAB_0011339e:
    pcStack_3a0 = (code *)0x1133a3;
    compact_with_snapshot_open_test();
LAB_001133a3:
    pcStack_3a0 = (code *)0x1133a8;
    compact_with_snapshot_open_test();
LAB_001133a8:
    pcStack_3a0 = (code *)0x1133ad;
    compact_with_snapshot_open_test();
LAB_001133ad:
    pcStack_3a0 = (code *)0x1133b2;
    compact_with_snapshot_open_test();
  }
  pcStack_3a0 = compaction_cb_get;
  compact_with_snapshot_open_test();
  pcStack_3e8 = (code *)0x1133d3;
  sStack_3b0 = sVar2;
  ppfStack_3a8 = local_138;
  pcStack_3a0 = (code *)uVar5;
  gettimeofday(&tStack_3c0,(__timezone_ptr_t)0x0);
  if ((int)ptr_handle == 2) {
    if (extraout_RDX == 0) {
      pcStack_3e8 = (code *)0x1133e2;
      compaction_cb_get();
      goto LAB_001133e2;
    }
  }
  else {
LAB_001133e2:
    if (extraout_RDX != 0) goto LAB_00113449;
  }
  pcStack_3e8 = (code *)0x1133f9;
  fVar1 = fdb_get_all_snap_markers((fdb_file_handle *)pfVar10,&pfStack_3d8,&uStack_3c8);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pcStack_3e8 = (code *)0x11341d;
    fVar1 = fdb_snapshot_open((fdb_kvs_handle *)(local_390->kvs_config).custom_cmp_param,
                              &pfStack_3d0,pfStack_3d8->kvs_markers->seqnum);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011343f;
    pcStack_3e8 = (code *)0x11342b;
    fVar1 = fdb_kvs_close(pfStack_3d0);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      return;
    }
  }
  else {
    pcStack_3e8 = (code *)0x11343f;
    compaction_cb_get();
LAB_0011343f:
    pcStack_3e8 = (code *)0x113444;
    compaction_cb_get();
  }
  pcStack_3e8 = (code *)0x113449;
  compaction_cb_get();
LAB_00113449:
  pcStack_3e8 = compact_with_snapshot_open_multi_kvs_test;
  compaction_cb_get();
  pcStack_3f0 = "body%04d";
  pfStack_400 = pfVar4;
  pcStack_7a0 = (code *)0x11346b;
  pcStack_408 = local_238;
  pcStack_3e8 = (code *)((ulong)ptr_handle & 0xffffffff);
  gettimeofday(&tStack_738,(__timezone_ptr_t)0x0);
  pcStack_7a0 = (code *)0x113470;
  memleak_start();
  pcStack_7a0 = (code *)0x113480;
  fdb_get_default_config();
  pcStack_7a0 = (code *)0x11348d;
  fdb_get_default_kvs_config();
  fStack_710.compaction_cb_ctx = &uStack_758;
  uStack_758 = 0;
  uStack_750 = 0;
  uStack_748 = 0;
  fStack_710.wal_threshold = 0x400;
  fStack_710.flags = 1;
  fStack_710.compaction_cb = compaction_cb_markers;
  fStack_710.compaction_cb_mask = 0x1b;
  pcStack_7a0 = (code *)0x1134d3;
  system("rm -rf  compact_test* > errorlog.txt");
  pcStack_7a0 = (code *)0x1134ea;
  fdb_open(&pfStack_790,"./compact_test1",&fStack_710);
  pcStack_7a0 = (code *)0x113501;
  fdb_kvs_open(pfStack_790,&pfStack_760,"db1",&fStack_728);
  pcStack_7a0 = (code *)0x113518;
  fdb_kvs_open(pfStack_790,&pfStack_768,"db2",&fStack_728);
  pcStack_7a0 = (code *)0x11352f;
  fdb_kvs_open(pfStack_790,&pfStack_770,"db3",&fStack_728);
  pcStack_7a0 = (code *)0x113546;
  fdb_kvs_open(pfStack_790,&pfStack_778,"db4",&fStack_728);
  pcStack_7a0 = (code *)0x11355d;
  fdb_kvs_open(pfStack_790,&pfStack_780,"db5",&fStack_728);
  uVar5 = 0;
  do {
    iVar7 = (int)uVar5;
    if (iVar7 == 5) goto LAB_001136e1;
    uVar5 = 0;
    iStack_784 = iVar7;
    do {
      pcStack_7a0 = (code *)0x11359b;
      sprintf(acStack_518,"key%04d",uVar5);
      pcStack_7a0 = (code *)0x1135aa;
      sprintf(acStack_618,"body%04d",uVar5);
      pfVar4 = pfStack_760;
      pcStack_7a0 = (code *)0x1135b7;
      sVar2 = strlen(acStack_518);
      pcStack_7a0 = (code *)0x1135c5;
      sVar3 = strlen(acStack_618);
      pcStack_7a0 = (code *)0x1135d9;
      fdb_set_kv(pfVar4,acStack_518,sVar2,acStack_618,sVar3);
      pfVar4 = pfStack_768;
      pcStack_7a0 = (code *)0x1135e6;
      sVar2 = strlen(acStack_518);
      pcStack_7a0 = (code *)0x1135f1;
      sVar3 = strlen(acStack_618);
      pcStack_7a0 = (code *)0x113605;
      fdb_set_kv(pfVar4,acStack_518,sVar2,acStack_618,sVar3);
      pfVar4 = pfStack_770;
      pcStack_7a0 = (code *)0x113612;
      sVar2 = strlen(acStack_518);
      pcStack_7a0 = (code *)0x11361d;
      sVar3 = strlen(acStack_618);
      pcStack_7a0 = (code *)0x113631;
      fdb_set_kv(pfVar4,acStack_518,sVar2,acStack_618,sVar3);
      pfVar4 = pfStack_778;
      pcStack_7a0 = (code *)0x11363e;
      sVar2 = strlen(acStack_518);
      pcStack_7a0 = (code *)0x113649;
      sVar3 = strlen(acStack_618);
      pcStack_7a0 = (code *)0x11365d;
      fdb_set_kv(pfVar4,acStack_518,sVar2,acStack_618,sVar3);
      pfVar10 = pfStack_780;
      pcStack_7a0 = (code *)0x11366a;
      pfVar4 = (fdb_kvs_handle *)strlen(acStack_518);
      pcStack_7a0 = (code *)0x113675;
      sVar2 = strlen(acStack_618);
      pcStack_7a0 = (code *)0x113693;
      fdb_set_kv(pfVar10,acStack_518,(size_t)pfVar4,acStack_618,sVar2);
      uVar6 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar6;
    } while (uVar6 != 1000);
    pcStack_7a0 = (code *)0x1136b0;
    fhandle = pfStack_790;
    fVar1 = fdb_commit(pfStack_790,'\x01');
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pcStack_7a0 = (code *)0x113740;
      compact_with_snapshot_open_multi_kvs_test();
      goto LAB_00113740;
    }
    uVar5 = (ulong)(iStack_784 + 1U);
    uStack_758 = CONCAT44(uStack_758._4_4_,(iStack_784 + 1U) * 1000);
    pcStack_7a0 = (code *)0x1136d4;
    fVar1 = fdb_compact(pfStack_790,(char *)0x0);
  } while (fVar1 == FDB_RESULT_SUCCESS);
  pcStack_7a0 = (code *)0x1136e1;
  compact_with_snapshot_open_multi_kvs_test();
LAB_001136e1:
  pcStack_7a0 = (code *)0x1136eb;
  fhandle = pfStack_790;
  fVar1 = fdb_close(pfStack_790);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pcStack_7a0 = (code *)0x1136f4;
    fVar1 = fdb_shutdown();
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcVar9 = "%s PASSED\n";
      if (compact_with_snapshot_open_multi_kvs_test()::__test_pass != '\0') {
        pcVar9 = "%s FAILED\n";
      }
      pcStack_7a0 = (code *)0x113729;
      fprintf(_stderr,pcVar9,"compact with snapshot_open multi kvs test");
      return;
    }
  }
  else {
LAB_00113740:
    pcStack_7a0 = (code *)0x113745;
    compact_with_snapshot_open_multi_kvs_test();
  }
  pcStack_7a0 = compaction_cb_markers;
  compact_with_snapshot_open_multi_kvs_test();
  pcStack_7a8 = "body%04d";
  pcStack_7c8 = "key%04d";
  pcStack_818 = (code *)0x11376f;
  pcStack_7c0 = acStack_618;
  pfStack_7b8 = pfVar4;
  pcStack_7b0 = acStack_518;
  pcStack_7a0 = (code *)uVar5;
  gettimeofday(&tStack_7d8,(__timezone_ptr_t)0x0);
  pcStack_818 = (code *)0x113779;
  fdb_get_default_kvs_config();
  iVar7 = *(int *)&pfStack_790->root;
  pcStack_818 = (code *)0x11378c;
  fVar1 = fdb_get_all_snap_markers(fhandle,(fdb_snapshot_info_t **)&pfStack_810,&uStack_800);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pfVar4 = pfStack_810;
    if ((pfStack_810->kvs_config).custom_cmp != (fdb_custom_cmp_variable)0x6) {
      pcStack_818 = (code *)0x113870;
      compaction_cb_markers();
      pfVar4 = pfStack_808;
    }
    if (*(fdb_seqnum_t *)((long)(pfVar4->kvs_config).custom_cmp_param + 8) == (long)iVar7) {
      if (uStack_800 != 0) {
        uVar8 = 0;
        uVar5 = uStack_800;
        do {
          if ((&pfVar4->kvs_config)[uVar8].custom_cmp != (fdb_custom_cmp_variable)0x0) {
            lVar11 = 0;
            p_Var12 = (fdb_custom_cmp_variable)0x0;
            do {
              pcVar9 = *(char **)((long)(&pfVar4->kvs_config)[uVar8].custom_cmp_param + lVar11);
              if (pcVar9 != (char *)0x0) {
                pcStack_818 = (code *)0x1137fa;
                fdb_kvs_open(fhandle,&pfStack_808,pcVar9,&fStack_7f0);
                pcStack_818 = (code *)0x11380c;
                fVar1 = fdb_snapshot_open(pfStack_808,&pfStack_7f8,(long)iVar7);
                if (fVar1 == FDB_RESULT_SUCCESS) {
                  pcStack_818 = (code *)0x11381a;
                  fVar1 = fdb_kvs_close(pfStack_7f8);
                  if (fVar1 != FDB_RESULT_SUCCESS) {
                    pcStack_818 = (code *)0x11387d;
                    compaction_cb_markers();
                    goto LAB_0011387d;
                  }
                  pcStack_818 = (code *)0x113828;
                  fVar1 = fdb_kvs_close(pfStack_808);
                  pfVar4 = pfStack_810;
                  if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_00113830;
                }
                else {
LAB_0011387d:
                  pcStack_818 = (code *)0x113882;
                  compaction_cb_markers();
                }
                pcStack_818 = (code *)0x113887;
                compaction_cb_markers();
                goto LAB_00113887;
              }
LAB_00113830:
              p_Var12 = p_Var12 + 1;
              lVar11 = lVar11 + 0x10;
              uVar5 = uStack_800;
            } while (p_Var12 < (&pfVar4->kvs_config)[uVar8].custom_cmp);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 < uVar5);
      }
      return;
    }
  }
  else {
LAB_00113887:
    pcStack_818 = (code *)0x11388c;
    compaction_cb_markers();
  }
  pcStack_818 = db_compact_during_compaction_cancellation;
  compaction_cb_markers();
  gettimeofday(&tStack_920,(__timezone_ptr_t)0x0);
  fdb_get_default_config();
  fStack_910.compaction_cb = cb_cancel_test;
  fStack_910.compaction_cb_ctx = (void *)0x0;
  fStack_910.compaction_cb_mask = 0x11;
  fVar1 = fdb_open(&pfStack_928,"compact_test",&fStack_910);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xcac);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xcac,"void *db_compact_during_compaction_cancellation(void *)");
  }
  fVar1 = fdb_compact(pfStack_928,(char *)0x0);
  if (((uint)(fVar1 + ~FDB_RESULT_SB_INIT_FAIL) < 0x2e) &&
     ((0x200004000001U >> ((ulong)(uint)(fVar1 + ~FDB_RESULT_SB_INIT_FAIL) & 0x3f) & 1) != 0)) {
    fdb_close(pfStack_928);
    pthread_exit((void *)0x0);
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
          ,0xcb1);
  __assert_fail("status == FDB_RESULT_SUCCESS || status == FDB_RESULT_COMPACTION_CANCELLATION || status == FDB_RESULT_FAIL_BY_ROLLBACK"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0xcb1,"void *db_compact_during_compaction_cancellation(void *)");
}

Assistant:

void compact_with_snapshot_open_test()
{
  TEST_INIT();
  memleak_start();

  int i, r;
  int n = 100000;
  char keybuf[256], bodybuf[256];
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db, *db2, *snap_db;
  fdb_status s;
  fdb_config fconfig = fdb_get_default_config();
  fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
  struct cb_args cb_args;

  memset(&cb_args, 0x0, sizeof(struct cb_args));
  fconfig.wal_threshold = 1024;
  fconfig.flags = FDB_OPEN_FLAG_CREATE;
  fconfig.compaction_cb = compaction_cb_get;
  fconfig.compaction_cb_ctx = &cb_args;
  fconfig.compaction_cb_mask = FDB_CS_BEGIN |
                               FDB_CS_MOVE_DOC |
                               FDB_CS_FLUSH_WAL |
                               FDB_CS_END;
  // remove previous compact_test files
  r = system(SHELL_DEL" compact_test* > errorlog.txt");
  (void)r;

  // open two handles for kvs
  fdb_open(&dbfile, "./compact_test1", &fconfig);
  fdb_kvs_open(dbfile, &db, "db", &kvs_config);
  fdb_kvs_open(dbfile, &db2, "db", &kvs_config);
  for (i=0;i<n;++i){
      sprintf(keybuf, "key%04d", i);
      sprintf(bodybuf, "body%04d", i);
      s = fdb_set_kv(db, keybuf, strlen(keybuf), bodybuf, strlen(bodybuf));
      TEST_CHK(s == FDB_RESULT_SUCCESS);
  }


  // commit
  s = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
  TEST_CHK(s == FDB_RESULT_SUCCESS);

  // point compact callback handle to db2
  cb_args.handle = db2;

  // compact
  s = fdb_compact(dbfile, NULL);
  TEST_CHK(s == FDB_RESULT_SUCCESS);

  // open compaction end
  s = fdb_snapshot_open(db2, &snap_db, n);
  TEST_CHK(s == FDB_RESULT_SUCCESS);

  fdb_kvs_close(snap_db);
  s = fdb_close(dbfile);
  TEST_CHK(s == FDB_RESULT_SUCCESS);
  s = fdb_shutdown();
  TEST_CHK(s == FDB_RESULT_SUCCESS);
  TEST_RESULT("compact with snapshot_open test");
}